

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmHttpProcessOneHeader(SyhttpHeader *pHdr,SyhttpHeader *pLast,char *zLine,sxu32 nLen)

{
  sxi32 sVar1;
  SyString *pSVar2;
  ushort **ppuVar3;
  bool bVar4;
  SyString *pTmp;
  sxi32 rc;
  sxu32 nPos;
  SyString *pName;
  char *pcStack_28;
  sxu32 nLen_local;
  char *zLine_local;
  SyhttpHeader *pLast_local;
  SyhttpHeader *pHdr_local;
  
  if (nLen == 0) {
    pHdr_local._4_4_ = -0x16;
  }
  else {
    pName._4_4_ = nLen;
    pcStack_28 = zLine;
    zLine_local = (char *)pLast;
    pLast_local = pHdr;
    if ((pLast == (SyhttpHeader *)0x0) || ((zLine[-1] != ' ' && (zLine[-1] != '\t')))) {
      _rc = pHdr;
      sVar1 = SyByteFind(zLine,nLen,0x3a,(sxu32 *)((long)&pTmp + 4));
      if (sVar1 == 0) {
        (_rc->sName).zString = pcStack_28;
        (_rc->sName).nByte = pTmp._4_4_;
        pTmp._0_4_ = 0;
        while( true ) {
          bVar4 = false;
          if (((_rc->sName).nByte != 0) && (bVar4 = false, (byte)*(_rc->sName).zString < 0xc0)) {
            ppuVar3 = __ctype_b_loc();
            bVar4 = ((*ppuVar3)[(int)*(_rc->sName).zString] & 0x2000) != 0;
          }
          if (!bVar4) break;
          (_rc->sName).nByte = (_rc->sName).nByte - 1;
          (_rc->sName).zString = (_rc->sName).zString + 1;
        }
        while( true ) {
          bVar4 = false;
          if (((_rc->sName).nByte != 0) &&
             (bVar4 = false, (byte)(_rc->sName).zString[(_rc->sName).nByte - 1] < 0xc0)) {
            ppuVar3 = __ctype_b_loc();
            bVar4 = ((*ppuVar3)[(int)(_rc->sName).zString[(_rc->sName).nByte - 1]] & 0x2000) != 0;
          }
          if (!bVar4) break;
          (_rc->sName).nByte = (_rc->sName).nByte - 1;
        }
        (pLast_local->sValue).zString = pcStack_28 + (pTmp._4_4_ + 1);
        (pLast_local->sValue).nByte = (pName._4_4_ - pTmp._4_4_) - 1;
        while( true ) {
          bVar4 = false;
          if (((pLast_local->sValue).nByte != 0) &&
             (bVar4 = false, (byte)*(pLast_local->sValue).zString < 0xc0)) {
            ppuVar3 = __ctype_b_loc();
            bVar4 = ((*ppuVar3)[(int)*(pLast_local->sValue).zString] & 0x2000) != 0;
          }
          if (!bVar4) break;
          (pLast_local->sValue).nByte = (pLast_local->sValue).nByte - 1;
          (pLast_local->sValue).zString = (pLast_local->sValue).zString + 1;
        }
        while( true ) {
          bVar4 = false;
          if (((pLast_local->sValue).nByte != 0) &&
             (bVar4 = false,
             (byte)(pLast_local->sValue).zString[(pLast_local->sValue).nByte - 1] < 0xc0)) {
            ppuVar3 = __ctype_b_loc();
            bVar4 = ((*ppuVar3)[(int)(pLast_local->sValue).zString[(pLast_local->sValue).nByte - 1]]
                    & 0x2000) != 0;
          }
          if (!bVar4) break;
          (pLast_local->sValue).nByte = (pLast_local->sValue).nByte - 1;
        }
        pHdr_local._4_4_ = 0;
      }
      else {
        pHdr_local._4_4_ = -0x16;
      }
    }
    else {
      pSVar2 = &pLast->sValue;
      while( true ) {
        bVar4 = false;
        if (((pLast->sValue).nByte != 0) && (bVar4 = false, (byte)*pSVar2->zString < 0xc0)) {
          ppuVar3 = __ctype_b_loc();
          bVar4 = ((*ppuVar3)[(int)*pSVar2->zString] & 0x2000) != 0;
        }
        if (!bVar4) break;
        (pLast->sValue).nByte = (pLast->sValue).nByte - 1;
        pSVar2->zString = pSVar2->zString + 1;
      }
      while( true ) {
        bVar4 = false;
        if (((pLast->sValue).nByte != 0) &&
           (bVar4 = false, (byte)pSVar2->zString[(pLast->sValue).nByte - 1] < 0xc0)) {
          ppuVar3 = __ctype_b_loc();
          bVar4 = ((*ppuVar3)[(int)pSVar2->zString[(pLast->sValue).nByte - 1]] & 0x2000) != 0;
        }
        if (!bVar4) break;
        (pLast->sValue).nByte = (pLast->sValue).nByte - 1;
      }
      if ((pLast->sValue).nByte == 0) {
        pSVar2->zString = pcStack_28;
        (pLast->sValue).nByte = pName._4_4_;
      }
      else {
        (pLast->sValue).nByte = ((int)pcStack_28 + pName._4_4_) - (int)pSVar2->zString;
      }
      pHdr_local._4_4_ = -0x19;
    }
  }
  return pHdr_local._4_4_;
}

Assistant:

static sxi32 VmHttpProcessOneHeader(SyhttpHeader *pHdr, SyhttpHeader *pLast, const char *zLine, sxu32 nLen)
 {
	 SyString *pName;
	 sxu32 nPos;
	 sxi32 rc;
	 if( nLen < 1 ){
		 return SXERR_NEXT;
	 }
	 /* Check for multi-line header */
	if( pLast && (zLine[-1] == ' ' || zLine[-1] == '\t') ){
		SyString *pTmp = &pLast->sValue;
		SyStringFullTrim(pTmp);
		if( pTmp->nByte == 0 ){
			SyStringInitFromBuf(pTmp, zLine, nLen);
		}else{
			/* Update header value length */
			pTmp->nByte = (sxu32)(&zLine[nLen] - pTmp->zString);
		}
		 /* Simply tell the caller to reset its states and get another line */
		 return SXERR_CONTINUE;
	 }
	/* Split the header */
	pName = &pHdr->sName;
	rc = SyByteFind(zLine, nLen, ':', &nPos);
	if(rc != SXRET_OK ){
		return SXERR_NEXT; /* Malformed header;Check the next entry */
	}
	SyStringInitFromBuf(pName, zLine, nPos);
	SyStringFullTrim(pName);
	/* Extract a header value */
	SyStringInitFromBuf(&pHdr->sValue, &zLine[nPos + 1], nLen - nPos - 1);
	/* Remove leading and trailing whitespaces */
	SyStringFullTrim(&pHdr->sValue);
	return SXRET_OK;
 }